

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

void lodepng::mulMatrixMatrix(float *result,float *a,float *b)

{
  long lVar1;
  float temp [9];
  float local_48 [12];
  
  mulMatrix(local_48,local_48 + 3,local_48 + 6,a,(double)*b,(double)b[3],(double)b[6]);
  mulMatrix(local_48 + 1,local_48 + 4,local_48 + 7,a,(double)b[1],(double)b[4],(double)b[7]);
  mulMatrix(local_48 + 2,local_48 + 5,local_48 + 8,a,(double)b[2],(double)b[5],(double)b[8]);
  for (lVar1 = 0; lVar1 != 9; lVar1 = lVar1 + 1) {
    result[lVar1] = local_48[lVar1];
  }
  return;
}

Assistant:

static void mulMatrixMatrix(float* result, const float* a, const float* b) {
  int i;
  float temp[9]; /* temp is to allow result and a or b to be the same */
  mulMatrix(&temp[0], &temp[3], &temp[6], a, b[0], b[3], b[6]);
  mulMatrix(&temp[1], &temp[4], &temp[7], a, b[1], b[4], b[7]);
  mulMatrix(&temp[2], &temp[5], &temp[8], a, b[2], b[5], b[8]);
  for(i = 0; i < 9; i++) result[i] = temp[i];
}